

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<true,_false,_false>::pack_bc(DaTrie<true,_false,_false> *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t node_pos;
  reference pvVar4;
  DaTrie<true,_false,_false> *in_RDI;
  Edge *unaff_retaddr;
  uint32_t in_stack_0000000c;
  DaTrie<true,_false,_false> *in_stack_00000010;
  Query *in_stack_00000018;
  Edge *in_stack_00000020;
  uint32_t base;
  uint32_t i;
  uint32_t max_pos;
  Edge edge;
  Query query;
  uint32_t in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffec0;
  uint uVar5;
  undefined4 in_stack_fffffffffffffecc;
  Edge local_128;
  Query local_20;
  DaTrie<true,_false,_false> *query_00;
  
  query_00 = in_RDI;
  Query::Query(&local_20);
  Edge::Edge(&local_128);
  while (uVar2 = bc_emps(in_RDI), 0xff < uVar2) {
    uVar3 = bc_size((DaTrie<true,_false,_false> *)0x163312);
    for (uVar5 = 0; uVar5 < 0x100; uVar5 = uVar5 + 1) {
      uVar3 = uVar3 - 1;
      pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar3)
      ;
      bVar1 = Bc::is_fixed(pvVar4);
      if (bVar1) break;
    }
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar3);
    node_pos = Bc::check(pvVar4);
    Query::set_node_pos(&local_20,node_pos);
    Query::node_pos(&local_20);
    edge_((DaTrie<true,_false,_false> *)CONCAT44(uVar5,in_stack_fffffffffffffec0),
          (uint32_t)((ulong)in_RDI >> 0x20),(Edge *)CONCAT44(uVar2,in_stack_fffffffffffffeb0),
          (size_t)&local_128);
    in_stack_fffffffffffffeb0 =
         excheck_((DaTrie<true,_false,_false> *)CONCAT44(in_stack_fffffffffffffecc,uVar3),
                  (Edge *)CONCAT44(uVar5,in_stack_fffffffffffffec0),
                  (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RDI);
    if (in_stack_fffffffffffffeb0 == 0xffffffff) break;
    in_stack_fffffffffffffec0 = in_stack_fffffffffffffeb0;
    shelter_(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(Query *)query_00);
    Query::node_pos(&local_20);
    move_(_max_pos,i,base,in_stack_00000020,in_stack_00000018);
  }
  Edge::~Edge(&local_128);
  Query::~Query(&local_20);
  return;
}

Assistant:

void pack_bc() {
    assert(!Prefix);

    Query query;
    Edge edge;

    while (BLOCK_SIZE <= bc_emps()) {
      auto max_pos = bc_size();
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        if (bc_[--max_pos].is_fixed()) {
          break;
        }
      }
      assert(bc_[max_pos].is_fixed());

      query.set_node_pos(bc_[max_pos].check());
      edge_(query.node_pos(), edge);

      auto base = excheck_(edge, blocks_);
      if (base == NOT_FOUND) {
        break;
      }

      shelter_(base, edge, query);
      move_(query.node_pos(), base, edge, query);
    }
  }